

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraphTest.cpp
# Opt level: O1

void __thiscall DynamicGraphTest::testInit(DynamicGraphTest *this)

{
  DynamicGraph *this_00;
  pointer psVar1;
  unsigned_long uVar2;
  __normal_iterator<const_boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>
  _Var3;
  EVP_PKEY_CTX *in_RSI;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  initializer_list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> __l;
  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  expectedVirtualEdges;
  undefined8 local_a0;
  undefined8 local_98;
  _List_node_base local_90;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_78;
  undefined8 local_60;
  undefined8 local_58;
  _List_node_base *local_50;
  undefined8 local_48;
  undefined8 local_40;
  _List_node_base *local_38;
  undefined8 local_30;
  undefined8 local_28;
  _List_node_base *local_20;
  
  this_00 = &this->G;
  DynamicGraph::init(this_00,in_RSI);
  uVar2 = DynamicGraph::getLevel(this_00,0);
  if (uVar2 != 0) {
    __assert_fail("G.getLevel(0)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x30,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,1);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(1)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x31,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,2);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(2)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x32,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,3);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(3)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x33,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,4);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(4)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x34,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,5);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(5)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x35,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,6);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(6)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x36,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,7);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(7)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x37,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,8);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(8)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x38,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,9);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(9)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x39,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,10);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(10)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3a,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,0xb);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(11)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3b,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,0xc);
  if (uVar2 != 3) {
    __assert_fail("G.getLevel(12)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3c,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,0xd);
  if (uVar2 != 3) {
    __assert_fail("G.getLevel(13)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3d,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,0xe);
  if (uVar2 != 4) {
    __assert_fail("G.getLevel(14)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3e,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,0xf);
  if (uVar2 != 3) {
    __assert_fail("G.getLevel(15)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x3f,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,0x10);
  if (uVar2 != 1) {
    __assert_fail("G.getLevel(16)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x40,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,0x11);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(17)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x41,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,0x12);
  if (uVar2 != 3) {
    __assert_fail("G.getLevel(18)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x42,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getLevel(this_00,0x13);
  if (uVar2 != 2) {
    __assert_fail("G.getLevel(19)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x43,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,0);
  if (uVar2 != 1) {
    __assert_fail("G.getComponent(0)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x46,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,1);
  if (uVar2 != 1) {
    __assert_fail("G.getComponent(1)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x47,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,2);
  if (uVar2 != 1) {
    __assert_fail("G.getComponent(2)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x48,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,3);
  if (uVar2 != 1) {
    __assert_fail("G.getComponent(3)==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x49,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,4);
  if (uVar2 != 2) {
    __assert_fail("G.getComponent(4)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4a,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,5);
  if (uVar2 != 2) {
    __assert_fail("G.getComponent(5)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4b,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,6);
  if (uVar2 != 2) {
    __assert_fail("G.getComponent(6)==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4c,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,7);
  if (uVar2 != 3) {
    __assert_fail("G.getComponent(7)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4d,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,8);
  if (uVar2 != 3) {
    __assert_fail("G.getComponent(8)==3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4e,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,9);
  if (uVar2 != 4) {
    __assert_fail("G.getComponent(9)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x4f,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,10);
  if (uVar2 != 4) {
    __assert_fail("G.getComponent(10)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x50,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,0xb);
  if (uVar2 != 4) {
    __assert_fail("G.getComponent(11)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x51,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,0xc);
  if (uVar2 != 4) {
    __assert_fail("G.getComponent(12)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x52,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,0xd);
  if (uVar2 != 4) {
    __assert_fail("G.getComponent(13)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x53,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,0xe);
  if (uVar2 != 4) {
    __assert_fail("G.getComponent(14)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x54,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,0xf);
  if (uVar2 != 4) {
    __assert_fail("G.getComponent(15)==4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x55,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,0x10);
  if (uVar2 != 5) {
    __assert_fail("G.getComponent(16)==5",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x56,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,0x11);
  if (uVar2 != 5) {
    __assert_fail("G.getComponent(17)==5",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x57,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,0x12);
  if (uVar2 != 5) {
    __assert_fail("G.getComponent(18)==5",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x58,"void DynamicGraphTest::testInit()");
  }
  uVar2 = DynamicGraph::getComponent(this_00,0x13);
  if (uVar2 != 5) {
    __assert_fail("G.getComponent(19)==5",
                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                  ,0x59,"void DynamicGraphTest::testInit()");
  }
  psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 4;
  local_78.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = 0;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                    (*(undefined8 *)
                      &(psVar1->super_StoredVertex).m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                     ,*(pointer *)
                       ((long)&(psVar1->super_StoredVertex).m_out_edges.
                               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                       + 8));
  if (_Var3._M_current ==
      *(pointer *)
       ((long)&(psVar1->super_StoredVertex).m_out_edges.
               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
       + 8)) {
    local_78.m_eproperty = (_List_node_base *)0x0;
  }
  else {
    local_78.m_eproperty = ((_Var3._M_current)->m_iter)._M_node + 2;
  }
  p_Var4 = (_List_node_base *)0x0;
  local_78.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0;
  local_78.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = 4;
  psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = 7;
  local_98 = 0;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                    (*(undefined8 *)
                      &(psVar1->super_StoredVertex).m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                     ,*(pointer *)
                       ((long)&(psVar1->super_StoredVertex).m_out_edges.
                               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                       + 8));
  if (_Var3._M_current !=
      *(pointer *)
       ((long)&(psVar1->super_StoredVertex).m_out_edges.
               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
       + 8)) {
    p_Var4 = ((_Var3._M_current)->m_iter)._M_node + 2;
  }
  p_Var5 = (_List_node_base *)0x0;
  local_60 = 0;
  local_58 = 7;
  psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = 9;
  local_98 = 0;
  local_50 = p_Var4;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                    (*(undefined8 *)
                      &(psVar1->super_StoredVertex).m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                     ,*(pointer *)
                       ((long)&(psVar1->super_StoredVertex).m_out_edges.
                               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                       + 8));
  if (_Var3._M_current !=
      *(pointer *)
       ((long)&(psVar1->super_StoredVertex).m_out_edges.
               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
       + 8)) {
    p_Var5 = ((_Var3._M_current)->m_iter)._M_node + 2;
  }
  p_Var4 = (_List_node_base *)0x0;
  local_48 = 0;
  local_40 = 9;
  psVar1 = (this->G).super_UndirectedGraph.super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = 0x10;
  local_98 = 0;
  local_38 = p_Var5;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>const>>
                    (*(undefined8 *)
                      &(psVar1->super_StoredVertex).m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                     ,*(pointer *)
                       ((long)&(psVar1->super_StoredVertex).m_out_edges.
                               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
                       + 8));
  if (_Var3._M_current !=
      *(pointer *)
       ((long)&(psVar1->super_StoredVertex).m_out_edges.
               super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
       + 8)) {
    p_Var4 = ((_Var3._M_current)->m_iter)._M_node + 2;
  }
  local_30 = 0;
  local_28 = 0x10;
  __l._M_len = 4;
  __l._M_array = &local_78;
  local_20 = p_Var4;
  std::__cxx11::
  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::list((list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
          *)&local_90,__l,(allocator_type *)&local_a0);
  testVirtualEdges(this,(list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                         *)&local_90);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[+] test init OK!",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  while (local_90._M_next != &local_90) {
    p_Var4 = (((_List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                *)&(local_90._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_90._M_next,0x28);
    local_90._M_next = p_Var4;
  }
  return;
}

Assistant:

void DynamicGraphTest::testInit()
{
    this->G.init();

    // test levels
    assert(G.getLevel(0)==0);
    assert(G.getLevel(1)==1);
    assert(G.getLevel(2)==1);
    assert(G.getLevel(3)==2);
    assert(G.getLevel(4)==1);
    assert(G.getLevel(5)==2);
    assert(G.getLevel(6)==2);
    assert(G.getLevel(7)==1);
    assert(G.getLevel(8)==2);
    assert(G.getLevel(9)==1);
    assert(G.getLevel(10)==2);
    assert(G.getLevel(11)==2);
    assert(G.getLevel(12)==3);
    assert(G.getLevel(13)==3);
    assert(G.getLevel(14)==4);
    assert(G.getLevel(15)==3);
    assert(G.getLevel(16)==1);
    assert(G.getLevel(17)==2);
    assert(G.getLevel(18)==3);
    assert(G.getLevel(19)==2);

    // test components
    assert(G.getComponent(0)==1);
    assert(G.getComponent(1)==1);
    assert(G.getComponent(2)==1);
    assert(G.getComponent(3)==1);
    assert(G.getComponent(4)==2);
    assert(G.getComponent(5)==2);
    assert(G.getComponent(6)==2);
    assert(G.getComponent(7)==3);
    assert(G.getComponent(8)==3);
    assert(G.getComponent(9)==4);
    assert(G.getComponent(10)==4);
    assert(G.getComponent(11)==4);
    assert(G.getComponent(12)==4);
    assert(G.getComponent(13)==4);
    assert(G.getComponent(14)==4);
    assert(G.getComponent(15)==4);
    assert(G.getComponent(16)==5);
    assert(G.getComponent(17)==5);
    assert(G.getComponent(18)==5);
    assert(G.getComponent(19)==5);

    // test virtual edges
    std::list<Edge> expectedVirtualEdges = {
            edge(0, 4, G).first,
            edge(0, 7, G).first,
            edge(0, 9, G).first,
            edge(0, 16, G).first
    };
    testVirtualEdges(expectedVirtualEdges);


    std::cout << "[+] test init OK!" << std::endl;
}